

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac *pFlac,ma_uint64 framesToRead,float *pBufferOut)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ma_bool32 mVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  byte bVar20;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  undefined1 auVar21 [16];
  ma_int32 sampleS32;
  uint j;
  ma_uint64 i_8;
  ma_int32 *pDecodedSamples1;
  ma_int32 *pDecodedSamples0;
  ma_uint64 frameCountThisIteration;
  ma_uint64 iFirstPCMFrame;
  uint channelCount;
  ma_uint32 unusedBitsPerSample;
  ma_uint64 framesRead;
  ma_uint8 lookup [11];
  ma_uint32 right_1;
  ma_uint32 side_1;
  ma_uint32 left_1;
  __m128 rightf;
  __m128 leftf;
  __m128i right;
  __m128i side;
  __m128i left;
  __m128 factor;
  ma_uint32 shift1;
  ma_uint32 shift0;
  ma_uint32 *pInputSamples1U32;
  ma_uint32 *pInputSamples0U32;
  ma_uint64 frameCount4;
  ma_uint64 i;
  ma_uint32 right_2;
  ma_uint32 side_2;
  ma_uint32 left_2;
  ma_uint32 right3;
  ma_uint32 right2;
  ma_uint32 right1;
  ma_uint32 right0;
  ma_uint32 side3;
  ma_uint32 side2;
  ma_uint32 side1;
  ma_uint32 side0;
  ma_uint32 left3;
  ma_uint32 left2;
  ma_uint32 left1;
  ma_uint32 left0;
  float factor_1;
  ma_uint32 shift1_1;
  ma_uint32 shift0_1;
  ma_uint32 *pInputSamples1U32_1;
  ma_uint32 *pInputSamples0U32_1;
  ma_uint64 frameCount4_1;
  ma_uint64 i_1;
  ma_uint32 left_4;
  ma_uint32 right_4;
  ma_uint32 side_4;
  __m128 rightf_1;
  __m128 leftf_1;
  __m128i left_3;
  __m128i right_3;
  __m128i side_3;
  __m128 factor_2;
  ma_uint32 shift1_2;
  ma_uint32 shift0_2;
  ma_uint32 *pInputSamples1U32_2;
  ma_uint32 *pInputSamples0U32_2;
  ma_uint64 frameCount4_2;
  ma_uint64 i_2;
  ma_uint32 left_5;
  ma_uint32 right_5;
  ma_uint32 side_5;
  ma_uint32 left3_1;
  ma_uint32 left2_1;
  ma_uint32 left1_1;
  ma_uint32 left0_1;
  ma_uint32 right3_1;
  ma_uint32 right2_1;
  ma_uint32 right1_1;
  ma_uint32 right0_1;
  ma_uint32 side3_1;
  ma_uint32 side2_1;
  ma_uint32 side1_1;
  ma_uint32 side0_1;
  float factor_3;
  ma_uint32 shift1_3;
  ma_uint32 shift0_3;
  ma_uint32 *pInputSamples1U32_3;
  ma_uint32 *pInputSamples0U32_3;
  ma_uint64 frameCount4_3;
  ma_uint64 i_3;
  ma_uint32 side_9;
  ma_uint32 mid_3;
  __m128 rightf_3;
  __m128 leftf_3;
  __m128i tempR_1;
  __m128i tempL_1;
  __m128i side_8;
  __m128i mid_2;
  ma_uint32 side_7;
  ma_uint32 mid_1;
  __m128 rightf_2;
  __m128 leftf_2;
  __m128i tempR;
  __m128i tempL;
  __m128i side_6;
  __m128i mid;
  __m128 factor128;
  float factor_4;
  ma_uint32 shift;
  ma_uint32 *pInputSamples1U32_4;
  ma_uint32 *pInputSamples0U32_4;
  ma_uint64 frameCount4_4;
  ma_uint64 i_4;
  ma_uint32 side_10;
  ma_uint32 mid_4;
  ma_uint32 side3_3;
  ma_uint32 side2_3;
  ma_uint32 side1_3;
  ma_uint32 side0_3;
  ma_uint32 mid3_1;
  ma_uint32 mid2_1;
  ma_uint32 mid1_1;
  ma_uint32 mid0_1;
  ma_uint32 temp3R_1;
  ma_uint32 temp2R_1;
  ma_uint32 temp1R_1;
  ma_uint32 temp0R_1;
  ma_uint32 temp3L_1;
  ma_uint32 temp2L_1;
  ma_uint32 temp1L_1;
  ma_uint32 temp0L_1;
  ma_uint32 side3_2;
  ma_uint32 side2_2;
  ma_uint32 side1_2;
  ma_uint32 side0_2;
  ma_uint32 mid3;
  ma_uint32 mid2;
  ma_uint32 mid1;
  ma_uint32 mid0;
  ma_uint32 temp3R;
  ma_uint32 temp2R;
  ma_uint32 temp1R;
  ma_uint32 temp0R;
  ma_uint32 temp3L;
  ma_uint32 temp2L;
  ma_uint32 temp1L;
  ma_uint32 temp0L;
  float factor_5;
  ma_uint32 shift_1;
  ma_uint32 *pInputSamples1U32_5;
  ma_uint32 *pInputSamples0U32_5;
  ma_uint64 frameCount4_5;
  ma_uint64 i_5;
  __m128 rightf_4;
  __m128 leftf_4;
  __m128i righti;
  __m128i lefti;
  __m128 factor128_1;
  float factor_6;
  ma_uint32 shift1_4;
  ma_uint32 shift0_4;
  ma_uint32 *pInputSamples1U32_6;
  ma_uint32 *pInputSamples0U32_6;
  ma_uint64 frameCount4_6;
  ma_uint64 i_6;
  ma_uint32 tempR3;
  ma_uint32 tempR2;
  ma_uint32 tempR1;
  ma_uint32 tempR0;
  ma_uint32 tempL3;
  ma_uint32 tempL2;
  ma_uint32 tempL1;
  ma_uint32 tempL0;
  float factor_7;
  ma_uint32 shift1_5;
  ma_uint32 shift0_5;
  ma_uint32 *pInputSamples1U32_7;
  ma_uint32 *pInputSamples0U32_7;
  ma_uint64 frameCount4_7;
  ma_uint64 i_7;
  ma_dr_flac *in_stack_fffffffffffff018;
  ma_dr_flac *in_stack_fffffffffffff020;
  uint local_fd4;
  ulong local_fd0;
  ulong local_fb8;
  ma_uint64 local_fa0;
  long local_f98;
  ulong local_f90;
  ma_uint64 local_f80;
  byte local_f74 [12];
  long local_f68;
  long local_f60;
  long local_f58;
  int local_f4c;
  ulong local_f48;
  long local_f38;
  long local_f30;
  long local_f28;
  int local_f1c;
  ulong local_f18;
  long local_f08;
  long local_f00;
  long local_ef8;
  int local_eec;
  ulong local_ee8;
  long local_ed8;
  long local_ed0;
  long local_ec8;
  int local_ebc;
  ulong local_eb8;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  int local_e78;
  int iStack_e74;
  int iStack_e70;
  int iStack_e6c;
  int local_e68;
  int iStack_e64;
  int iStack_e60;
  int iStack_e5c;
  int local_e58;
  int iStack_e54;
  int iStack_e50;
  int iStack_e4c;
  undefined1 local_e48 [16];
  int local_e30;
  int local_e2c;
  long local_e28;
  long local_e20;
  ulong local_e18;
  ulong local_e10;
  long local_e08;
  long local_e00;
  long local_df8;
  int local_dec;
  ulong local_de8;
  undefined4 local_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  undefined4 local_dc8;
  undefined8 local_db8;
  undefined8 uStack_db0;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  undefined8 local_d98;
  undefined8 uStack_d90;
  float local_d88;
  float fStack_d84;
  float fStack_d80;
  float fStack_d7c;
  undefined4 local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  undefined1 (*local_d60) [16];
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  undefined8 *local_d48;
  int local_d3c;
  undefined8 local_d38;
  undefined8 uStack_d30;
  int local_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  int local_cd0;
  int local_ccc;
  int local_cc8;
  int local_cc4;
  int local_cc0;
  int local_cbc;
  int local_cb8;
  int local_cb4;
  int local_cb0;
  int local_cac;
  int local_ca8;
  int local_ca4;
  int local_ca0;
  int local_c9c;
  int local_c98;
  undefined4 local_c94;
  int local_c90;
  int local_c8c;
  long local_c88;
  long local_c80;
  ulong local_c78;
  ulong local_c70;
  long local_c68;
  long local_c60;
  long local_c58;
  int local_c4c;
  ulong local_c48;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined4 uStack_be0;
  float fStack_bdc;
  int iStack_bd8;
  int local_bd4;
  int local_bd0;
  int local_bcc;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  int local_ba8;
  int iStack_ba4;
  int iStack_ba0;
  int iStack_b9c;
  int local_b98;
  int iStack_b94;
  int iStack_b90;
  int iStack_b8c;
  int local_b88;
  int iStack_b84;
  int iStack_b80;
  int iStack_b7c;
  undefined1 local_b78 [16];
  int local_b60;
  int local_b5c;
  long local_b58;
  long local_b50;
  ulong local_b48;
  ulong local_b40;
  long local_b38;
  long local_b30;
  long local_b28;
  int local_b1c;
  ulong local_b18;
  undefined4 local_b08;
  undefined4 uStack_b04;
  undefined4 uStack_b00;
  undefined4 uStack_afc;
  undefined4 local_af8;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  undefined4 local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  undefined1 (*local_a90) [16];
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  undefined8 *local_a78;
  int local_a6c;
  undefined8 local_a68;
  undefined8 uStack_a60;
  int local_a4c;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 *local_a38;
  undefined8 *local_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined4 uStack_9b0;
  float fStack_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  int local_998;
  int local_994;
  int local_990;
  int local_98c;
  int local_988;
  int local_984;
  int local_980;
  int local_97c;
  int local_978;
  int local_974;
  int local_970;
  undefined4 local_96c;
  int local_968;
  int local_964;
  long local_960;
  long local_958;
  ulong local_950;
  ulong local_948;
  long local_940;
  long local_938;
  long local_930;
  int local_924;
  ulong local_920;
  uint local_910;
  uint local_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8bc;
  undefined8 local_8b8;
  ulong uStack_8b0;
  uint local_8a0;
  uint local_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  uint local_878;
  int iStack_874;
  int iStack_870;
  int iStack_86c;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  undefined8 local_848;
  ulong uStack_840;
  undefined1 local_838 [16];
  undefined4 local_820;
  int local_81c;
  long local_818;
  long local_810;
  ulong local_808;
  ulong local_800;
  long local_7f8;
  long local_7f0;
  long local_7e8;
  int local_7dc;
  ulong local_7d8;
  undefined4 local_7c8;
  undefined4 uStack_7c4;
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  undefined4 local_7b8;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined4 local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  undefined1 (*local_710) [16];
  float local_708;
  float fStack_704;
  float fStack_700;
  float fStack_6fc;
  undefined8 *local_6f0;
  undefined4 local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined1 (*local_6d0) [16];
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 *local_6b8;
  int local_6ac;
  int local_6a8;
  int iStack_6a4;
  int iStack_6a0;
  int iStack_69c;
  int local_68c;
  int local_688;
  int iStack_684;
  int iStack_680;
  int iStack_67c;
  undefined4 local_66c;
  undefined8 local_668;
  ulong uStack_660;
  uint local_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  uint local_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined4 local_60c;
  undefined8 local_608;
  ulong uStack_600;
  uint local_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  uint local_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 local_598;
  ulong uStack_590;
  ulong local_588;
  ulong uStack_580;
  undefined8 local_578;
  ulong uStack_570;
  ulong local_568;
  ulong uStack_560;
  undefined8 local_558;
  ulong uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  ulong uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  ulong local_518;
  ulong uStack_510;
  int local_508;
  undefined4 uStack_504;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  ulong local_4f8;
  ulong uStack_4f0;
  int local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  ulong local_4a8;
  ulong uStack_4a0;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  undefined4 local_46c;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_428;
  undefined4 local_424;
  undefined4 local_420;
  undefined4 local_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined4 uStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined4 uStack_360;
  float fStack_35c;
  uint local_358;
  uint local_354;
  uint local_350;
  uint local_34c;
  uint local_348;
  uint local_344;
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  undefined4 local_2d0;
  int local_2cc;
  long local_2c8;
  long local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  int local_28c;
  ulong local_288;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined1 local_238 [16];
  undefined4 local_224;
  int local_220;
  int local_21c;
  long local_218;
  long local_210;
  ulong local_208;
  ulong local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  int local_1dc;
  ulong local_1d8;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined4 local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 (*local_150) [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_138;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  float fStack_8c;
  int iStack_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  long local_30;
  long local_28;
  long local_20;
  int local_14;
  ulong local_10;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_f80 = 0;
  }
  else if (in_RDX == 0) {
    local_f80 = ma_dr_flac__seek_forward_by_pcm_frames
                          (in_stack_fffffffffffff020,(ma_uint64)in_stack_fffffffffffff018);
  }
  else {
    iVar3 = -(uint)*(byte *)(in_RDI + 0x35);
    iVar15 = iVar3 + 0x20;
    local_fa0 = 0;
    local_f98 = in_RDX;
    local_f90 = in_RSI;
    do {
      while( true ) {
        if (local_f90 == 0) goto LAB_0023b31b;
        if (*(int *)(in_RDI + 0x60) == 0) break;
        local_f74[0xb] = *(char *)(in_RDI + 0x5a);
        local_f74[0] = 1;
        local_f74[1] = 2;
        local_f74[2] = 3;
        local_f74[3] = 4;
        local_f74[4] = 5;
        local_f74[5] = 6;
        local_f74[6] = 7;
        local_f74[7] = 8;
        local_f74[8] = 2;
        local_f74[9] = 2;
        local_f74[10] = 2;
        uVar17 = (uint)local_f74[*(char *)(in_RDI + 0x5a)];
        uVar18 = (ulong)((uint)*(ushort *)(in_RDI + 0x58) - *(int *)(in_RDI + 0x60));
        local_fb8 = local_f90;
        if (*(uint *)(in_RDI + 0x60) < local_f90) {
          local_fb8 = (ulong)*(uint *)(in_RDI + 0x60);
        }
        bVar19 = (byte)iVar15;
        if (uVar17 == 2) {
          lVar1 = *(long *)(in_RDI + 0x70) + uVar18 * 4;
          lVar2 = *(long *)(in_RDI + 0x80) + uVar18 * 4;
          switch(*(undefined1 *)(in_RDI + 0x5a)) {
          case 0:
          default:
            local_eb8 = local_fb8;
            local_ebc = iVar15;
            local_ec8 = lVar1;
            local_ed0 = lVar2;
            local_ed8 = local_f98;
            if ((ma_dr_flac__gIsSSE2Supported == 0) || (0x18 < *(byte *)(in_RDI + 0x35))) {
              local_10 = local_fb8;
              local_14 = iVar15;
              local_20 = lVar1;
              local_28 = lVar2;
              local_30 = local_f98;
              local_40 = local_fb8 >> 2;
              local_48 = lVar1;
              local_50 = lVar2;
              local_54 = iVar15 + (uint)*(byte *)(in_RDI + 0x69);
              local_58 = iVar15 + (uint)*(byte *)(in_RDI + 0x79);
              local_5c = 0x30000000;
              local_38 = 0;
              while( true ) {
                bVar20 = (byte)local_54;
                bVar19 = (byte)local_58;
                if (local_40 <= local_38) break;
                local_60 = *(int *)(lVar1 + local_38 * 0x10) << (bVar20 & 0x1f);
                local_64 = *(int *)(lVar1 + 4 + local_38 * 0x10) << (bVar20 & 0x1f);
                local_68 = *(int *)(lVar1 + 8 + local_38 * 0x10) << (bVar20 & 0x1f);
                local_6c = *(int *)(lVar1 + 0xc + local_38 * 0x10) << (bVar20 & 0x1f);
                local_70 = *(int *)(lVar2 + local_38 * 0x10) << (bVar19 & 0x1f);
                local_74 = *(int *)(lVar2 + 4 + local_38 * 0x10) << (bVar19 & 0x1f);
                local_78 = *(int *)(lVar2 + 8 + local_38 * 0x10) << (bVar19 & 0x1f);
                local_7c = *(int *)(lVar2 + 0xc + local_38 * 0x10) << (bVar19 & 0x1f);
                *(float *)(local_f98 + local_38 * 0x20) = (float)local_60 * 4.656613e-10;
                *(float *)(local_f98 + 4 + local_38 * 0x20) = (float)local_70 * 4.656613e-10;
                *(float *)(local_f98 + 8 + local_38 * 0x20) = (float)local_64 * 4.656613e-10;
                *(float *)(local_f98 + 0xc + local_38 * 0x20) = (float)local_74 * 4.656613e-10;
                *(float *)(local_f98 + 0x10 + local_38 * 0x20) = (float)local_68 * 4.656613e-10;
                *(float *)(local_f98 + 0x14 + local_38 * 0x20) = (float)local_78 * 4.656613e-10;
                *(float *)(local_f98 + 0x18 + local_38 * 0x20) = (float)local_6c * 4.656613e-10;
                *(float *)(local_f98 + 0x1c + local_38 * 0x20) = (float)local_7c * 4.656613e-10;
                local_38 = local_38 + 1;
              }
              for (local_38 = local_40 << 2; local_38 < local_fb8; local_38 = local_38 + 1) {
                *(float *)(local_f98 + local_38 * 8) =
                     (float)(*(int *)(lVar1 + local_38 * 4) << (bVar20 & 0x1f)) * 4.656613e-10;
                *(float *)(local_f98 + 4 + local_38 * 8) =
                     (float)(*(int *)(lVar2 + local_38 * 4) << (bVar19 & 0x1f)) * 4.656613e-10;
              }
            }
            else {
              local_1d8 = local_fb8;
              local_1dc = iVar15;
              local_1e8 = lVar1;
              local_1f0 = lVar2;
              local_1f8 = local_f98;
              local_208 = local_fb8 >> 2;
              local_210 = lVar1;
              local_218 = lVar2;
              local_21c = iVar3 + 0x18 + (uint)*(byte *)(in_RDI + 0x69);
              local_220 = iVar3 + 0x18 + (uint)*(byte *)(in_RDI + 0x79);
              local_224 = 0x34000000;
              local_1b8 = 0x34000000;
              local_1c8 = 0x34000000;
              uStack_1c4 = 0x34000000;
              uStack_1c0 = 0x34000000;
              uStack_1bc = 0x34000000;
              local_238._8_4_ = 0x34000000;
              local_238._0_8_ = 0x3400000034000000;
              local_238._12_4_ = 0x34000000;
              auVar21 = local_238;
              for (local_200 = 0; local_200 < local_208; local_200 = local_200 + 1) {
                local_f0 = (undefined8 *)(lVar1 + local_200 * 0x10);
                local_108 = *local_f0;
                uStack_d0 = local_f0[1];
                uVar10 = local_108;
                uStack_100 = uStack_d0;
                uVar11 = uStack_100;
                local_10c = local_21c;
                local_108._4_4_ = (int)((ulong)local_108 >> 0x20);
                uStack_100._0_4_ = (int)uStack_d0;
                uStack_100._4_4_ = (int)((ulong)uStack_d0 >> 0x20);
                local_248 = (int)local_108 << local_21c;
                iStack_244 = local_108._4_4_;
                iStack_240 = (int)uStack_100;
                iStack_23c = uStack_100._4_4_;
                local_f8 = (undefined8 *)(lVar2 + local_200 * 0x10);
                local_128 = *local_f8;
                uStack_e0 = local_f8[1];
                uVar8 = local_128;
                uStack_120 = uStack_e0;
                uVar9 = uStack_120;
                local_12c = local_220;
                local_128._4_4_ = (int)((ulong)local_128 >> 0x20);
                uStack_120._0_4_ = (int)uStack_e0;
                uStack_120._4_4_ = (int)((ulong)uStack_e0 >> 0x20);
                local_258 = (int)local_128 << local_220;
                iStack_254 = local_128._4_4_;
                iStack_250 = (int)uStack_120;
                iStack_24c = uStack_120._4_4_;
                local_d8 = CONCAT44(local_108._4_4_,local_248);
                local_178 = (float)local_248;
                fStack_174 = (float)local_108._4_4_;
                fStack_170 = (float)(int)uStack_100;
                fStack_16c = (float)uStack_100._4_4_;
                local_188 = 0x3400000034000000;
                uStack_180 = local_238._8_8_;
                local_268 = (float)local_248 * 1.1920929e-07;
                fStack_264 = (float)local_108._4_4_ * 1.1920929e-07;
                fStack_260 = (float)(int)uStack_100 * 1.1920929e-07;
                fStack_25c = (float)uStack_100._4_4_ * 1.1920929e-07;
                local_e8 = CONCAT44(local_128._4_4_,local_258);
                local_198 = (float)local_258;
                fStack_194 = (float)local_128._4_4_;
                fStack_190 = (float)(int)uStack_120;
                fStack_18c = (float)uStack_120._4_4_;
                local_1a8 = 0x3400000034000000;
                uStack_1a0 = local_238._8_8_;
                local_278 = (float)local_258 * 1.1920929e-07;
                fStack_274 = (float)local_128._4_4_ * 1.1920929e-07;
                fStack_270 = (float)(int)uStack_120 * 1.1920929e-07;
                fStack_26c = (float)uStack_120._4_4_ * 1.1920929e-07;
                local_138 = (undefined8 *)(local_f98 + local_200 * 0x20);
                local_b8 = CONCAT44(fStack_264,local_268);
                uStack_b0 = CONCAT44(fStack_25c,fStack_260);
                local_c8 = CONCAT44(fStack_274,local_278);
                uStack_c0 = CONCAT44(fStack_26c,fStack_270);
                local_148 = local_268;
                fStack_144 = local_278;
                fStack_140 = fStack_264;
                fStack_13c = fStack_274;
                *local_138 = CONCAT44(local_278,local_268);
                local_138[1] = CONCAT44(fStack_274,fStack_264);
                local_150 = (undefined1 (*) [16])(local_f98 + 0x10 + local_200 * 0x20);
                local_98 = CONCAT44(fStack_264,local_268);
                fStack_8c = fStack_25c;
                iStack_88 = local_258;
                local_a8 = CONCAT44(fStack_274,local_278);
                uStack_a0 = CONCAT44(fStack_26c,fStack_270);
                local_168 = uStack_90;
                fStack_164 = fStack_270;
                fStack_160 = fStack_25c;
                fStack_15c = fStack_26c;
                auVar7._4_4_ = fStack_270;
                auVar7._0_4_ = uStack_90;
                auVar7._8_4_ = fStack_25c;
                auVar7._12_4_ = fStack_26c;
                *local_150 = auVar7;
                local_128 = uVar8;
                uStack_120 = uVar9;
                local_108 = uVar10;
                uStack_100 = uVar11;
              }
              for (local_200 = local_208 << 2; local_238 = auVar21, local_200 < local_fb8;
                  local_200 = local_200 + 1) {
                *(float *)(local_f98 + local_200 * 8) =
                     (float)(*(int *)(lVar1 + local_200 * 4) << ((byte)local_21c & 0x1f)) *
                     1.1920929e-07;
                *(float *)(local_f98 + 4 + local_200 * 8) =
                     (float)(*(int *)(lVar2 + local_200 * 4) << ((byte)local_220 & 0x1f)) *
                     1.1920929e-07;
              }
            }
            break;
          case 8:
            local_f48 = local_fb8;
            local_f4c = iVar15;
            local_f58 = lVar1;
            local_f60 = lVar2;
            local_f68 = local_f98;
            if ((ma_dr_flac__gIsSSE2Supported == 0) || (0x18 < *(byte *)(in_RDI + 0x35))) {
              local_c48 = local_fb8;
              local_c4c = iVar15;
              local_c58 = lVar1;
              local_c60 = lVar2;
              local_c68 = local_f98;
              local_c78 = local_fb8 >> 2;
              local_c80 = lVar1;
              local_c88 = lVar2;
              local_c8c = iVar15 + (uint)*(byte *)(in_RDI + 0x69);
              local_c90 = iVar15 + (uint)*(byte *)(in_RDI + 0x79);
              local_c94 = 0x30000000;
              local_c70 = 0;
              while( true ) {
                bVar20 = (byte)local_c8c;
                bVar19 = (byte)local_c90;
                if (local_c78 <= local_c70) break;
                local_c98 = *(int *)(lVar1 + local_c70 * 0x10) << (bVar20 & 0x1f);
                local_c9c = *(int *)(lVar1 + 4 + local_c70 * 0x10) << (bVar20 & 0x1f);
                local_ca0 = *(int *)(lVar1 + 8 + local_c70 * 0x10) << (bVar20 & 0x1f);
                local_ca4 = *(int *)(lVar1 + 0xc + local_c70 * 0x10) << (bVar20 & 0x1f);
                local_ca8 = *(int *)(lVar2 + local_c70 * 0x10) << (bVar19 & 0x1f);
                local_cac = *(int *)(lVar2 + 4 + local_c70 * 0x10) << (bVar19 & 0x1f);
                local_cb0 = *(int *)(lVar2 + 8 + local_c70 * 0x10) << (bVar19 & 0x1f);
                local_cb4 = *(int *)(lVar2 + 0xc + local_c70 * 0x10) << (bVar19 & 0x1f);
                local_cb8 = local_c98 - local_ca8;
                local_cbc = local_c9c - local_cac;
                local_cc0 = local_ca0 - local_cb0;
                local_cc4 = local_ca4 - local_cb4;
                *(float *)(local_f98 + local_c70 * 0x20) = (float)local_c98 * 4.656613e-10;
                *(float *)(local_f98 + 4 + local_c70 * 0x20) = (float)local_cb8 * 4.656613e-10;
                *(float *)(local_f98 + 8 + local_c70 * 0x20) = (float)local_c9c * 4.656613e-10;
                *(float *)(local_f98 + 0xc + local_c70 * 0x20) = (float)local_cbc * 4.656613e-10;
                *(float *)(local_f98 + 0x10 + local_c70 * 0x20) = (float)local_ca0 * 4.656613e-10;
                *(float *)(local_f98 + 0x14 + local_c70 * 0x20) = (float)local_cc0 * 4.656613e-10;
                *(float *)(local_f98 + 0x18 + local_c70 * 0x20) = (float)local_ca4 * 4.656613e-10;
                *(float *)(local_f98 + 0x1c + local_c70 * 0x20) = (float)local_cc4 * 4.656613e-10;
                local_c70 = local_c70 + 1;
              }
              for (local_c70 = local_c78 << 2; local_c70 < local_fb8; local_c70 = local_c70 + 1) {
                local_cc8 = *(int *)(lVar1 + local_c70 * 4) << (bVar20 & 0x1f);
                local_ccc = *(int *)(lVar2 + local_c70 * 4) << (bVar19 & 0x1f);
                local_cd0 = local_cc8 - local_ccc;
                *(float *)(local_f98 + local_c70 * 8) = (float)local_cc8 * 4.656613e-10;
                *(float *)(local_f98 + 4 + local_c70 * 8) = (float)local_cd0 * 4.656613e-10;
              }
            }
            else {
              local_de8 = local_fb8;
              local_dec = iVar15;
              local_df8 = lVar1;
              local_e00 = lVar2;
              local_e08 = local_f98;
              local_e18 = local_fb8 >> 2;
              local_e20 = lVar1;
              local_e28 = lVar2;
              local_e2c = iVar3 + 0x18 + (uint)*(byte *)(in_RDI + 0x69);
              local_e30 = iVar3 + 0x18 + (uint)*(byte *)(in_RDI + 0x79);
              local_dc8 = 0x34000000;
              local_dd8 = 0x34000000;
              uStack_dd4 = 0x34000000;
              uStack_dd0 = 0x34000000;
              uStack_dcc = 0x34000000;
              local_e48._8_4_ = 0x34000000;
              local_e48._0_8_ = 0x3400000034000000;
              local_e48._12_4_ = 0x34000000;
              auVar21 = local_e48;
              for (local_e10 = 0; local_e10 < local_e18; local_e10 = local_e10 + 1) {
                local_d00 = (undefined8 *)(lVar1 + local_e10 * 0x10);
                local_d18 = *local_d00;
                uStack_ce0 = local_d00[1];
                uVar10 = local_d18;
                uStack_d10 = uStack_ce0;
                uVar11 = uStack_d10;
                local_d1c = local_e2c;
                local_d18._4_4_ = (int)((ulong)local_d18 >> 0x20);
                uStack_d10._0_4_ = (int)uStack_ce0;
                uStack_d10._4_4_ = (int)((ulong)uStack_ce0 >> 0x20);
                local_e58 = (int)local_d18 << local_e2c;
                iStack_e54 = local_d18._4_4_;
                iStack_e50 = (int)uStack_d10;
                iStack_e4c = uStack_d10._4_4_;
                local_d08 = (undefined8 *)(lVar2 + local_e10 * 0x10);
                local_d38 = *local_d08;
                uStack_cf0 = local_d08[1];
                uVar8 = local_d38;
                uStack_d30 = uStack_cf0;
                uVar9 = uStack_d30;
                local_d3c = local_e30;
                local_d38._4_4_ = (int)((ulong)local_d38 >> 0x20);
                uStack_d30._0_4_ = (int)uStack_cf0;
                uStack_d30._4_4_ = (int)((ulong)uStack_cf0 >> 0x20);
                local_e68 = (int)local_d38 << local_e30;
                iStack_e64 = local_d38._4_4_;
                iStack_e60 = (int)uStack_d30;
                iStack_e5c = uStack_d30._4_4_;
                local_ce8 = CONCAT44(local_d18._4_4_,local_e58);
                local_cf8 = CONCAT44(local_d38._4_4_,local_e68);
                local_e78 = local_e58 - local_e68;
                iStack_e74 = local_d18._4_4_ - local_d38._4_4_;
                iStack_e70 = (int)uStack_d10 - (int)uStack_d30;
                iStack_e6c = uStack_d10._4_4_ - uStack_d30._4_4_;
                local_c28 = CONCAT44(local_d18._4_4_,local_e58);
                uStack_c20 = uStack_ce0;
                local_d88 = (float)local_e58;
                fStack_d84 = (float)local_d18._4_4_;
                fStack_d80 = (float)(int)uStack_d10;
                fStack_d7c = (float)uStack_d10._4_4_;
                local_d98 = 0x3400000034000000;
                uStack_d90 = local_e48._8_8_;
                local_e88 = (float)local_e58 * 1.1920929e-07;
                fStack_e84 = (float)local_d18._4_4_ * 1.1920929e-07;
                fStack_e80 = (float)(int)uStack_d10 * 1.1920929e-07;
                fStack_e7c = (float)uStack_d10._4_4_ * 1.1920929e-07;
                local_c38 = CONCAT44(iStack_e74,local_e78);
                uStack_c30 = CONCAT44(iStack_e6c,iStack_e70);
                local_da8 = (float)local_e78;
                fStack_da4 = (float)iStack_e74;
                fStack_da0 = (float)iStack_e70;
                fStack_d9c = (float)iStack_e6c;
                local_db8 = 0x3400000034000000;
                uStack_db0 = local_e48._8_8_;
                local_e98 = (float)local_e78 * 1.1920929e-07;
                fStack_e94 = (float)iStack_e74 * 1.1920929e-07;
                fStack_e90 = (float)iStack_e70 * 1.1920929e-07;
                fStack_e8c = (float)iStack_e6c * 1.1920929e-07;
                local_d48 = (undefined8 *)(local_f98 + local_e10 * 0x20);
                local_c08 = CONCAT44(fStack_e84,local_e88);
                uStack_c00 = CONCAT44(fStack_e7c,fStack_e80);
                local_c18 = CONCAT44(fStack_e94,local_e98);
                uStack_c10 = CONCAT44(fStack_e8c,fStack_e90);
                local_d58 = local_e88;
                fStack_d54 = local_e98;
                fStack_d50 = fStack_e84;
                fStack_d4c = fStack_e94;
                *local_d48 = CONCAT44(local_e98,local_e88);
                local_d48[1] = CONCAT44(fStack_e94,fStack_e84);
                local_d60 = (undefined1 (*) [16])(local_f98 + 0x10 + local_e10 * 0x20);
                local_be8 = CONCAT44(fStack_e84,local_e88);
                fStack_bdc = fStack_e7c;
                iStack_bd8 = local_e78;
                local_bf8 = CONCAT44(fStack_e94,local_e98);
                uStack_bf0 = CONCAT44(fStack_e8c,fStack_e90);
                local_d78 = uStack_be0;
                fStack_d74 = fStack_e90;
                fStack_d70 = fStack_e7c;
                fStack_d6c = fStack_e8c;
                auVar4._4_4_ = fStack_e90;
                auVar4._0_4_ = uStack_be0;
                auVar4._8_4_ = fStack_e7c;
                auVar4._12_4_ = fStack_e8c;
                *local_d60 = auVar4;
                local_d38 = uVar8;
                uStack_d30 = uVar9;
                local_d18 = uVar10;
                uStack_d10 = uVar11;
              }
              for (local_e10 = local_e18 << 2; local_e48 = auVar21, local_e10 < local_fb8;
                  local_e10 = local_e10 + 1) {
                local_e9c = *(int *)(lVar1 + local_e10 * 4) << ((byte)local_e2c & 0x1f);
                local_ea0 = *(int *)(lVar2 + local_e10 * 4) << ((byte)local_e30 & 0x1f);
                local_ea4 = local_e9c - local_ea0;
                *(float *)(local_f98 + local_e10 * 8) = (float)local_e9c / 8388608.0;
                *(float *)(local_f98 + 4 + local_e10 * 8) = (float)local_ea4 / 8388608.0;
              }
            }
            break;
          case 9:
            local_f18 = local_fb8;
            local_f1c = iVar15;
            local_f28 = lVar1;
            local_f30 = lVar2;
            local_f38 = local_f98;
            if ((ma_dr_flac__gIsSSE2Supported == 0) || (0x18 < *(byte *)(in_RDI + 0x35))) {
              local_920 = local_fb8;
              local_924 = iVar15;
              local_930 = lVar1;
              local_938 = lVar2;
              local_940 = local_f98;
              local_950 = local_fb8 >> 2;
              local_958 = lVar1;
              local_960 = lVar2;
              local_964 = iVar15 + (uint)*(byte *)(in_RDI + 0x69);
              local_968 = iVar15 + (uint)*(byte *)(in_RDI + 0x79);
              local_96c = 0x30000000;
              local_948 = 0;
              while( true ) {
                bVar20 = (byte)local_964;
                bVar19 = (byte)local_968;
                if (local_950 <= local_948) break;
                local_970 = *(int *)(lVar1 + local_948 * 0x10) << (bVar20 & 0x1f);
                local_974 = *(int *)(lVar1 + 4 + local_948 * 0x10) << (bVar20 & 0x1f);
                local_978 = *(int *)(lVar1 + 8 + local_948 * 0x10) << (bVar20 & 0x1f);
                local_97c = *(int *)(lVar1 + 0xc + local_948 * 0x10) << (bVar20 & 0x1f);
                local_980 = *(int *)(lVar2 + local_948 * 0x10) << (bVar19 & 0x1f);
                local_984 = *(int *)(lVar2 + 4 + local_948 * 0x10) << (bVar19 & 0x1f);
                local_988 = *(int *)(lVar2 + 8 + local_948 * 0x10) << (bVar19 & 0x1f);
                local_98c = *(int *)(lVar2 + 0xc + local_948 * 0x10) << (bVar19 & 0x1f);
                local_990 = local_980 + local_970;
                local_994 = local_984 + local_974;
                local_998 = local_988 + local_978;
                local_99c = local_98c + local_97c;
                *(float *)(local_f98 + local_948 * 0x20) = (float)local_990 * 4.656613e-10;
                *(float *)(local_f98 + 4 + local_948 * 0x20) = (float)local_980 * 4.656613e-10;
                *(float *)(local_f98 + 8 + local_948 * 0x20) = (float)local_994 * 4.656613e-10;
                *(float *)(local_f98 + 0xc + local_948 * 0x20) = (float)local_984 * 4.656613e-10;
                *(float *)(local_f98 + 0x10 + local_948 * 0x20) = (float)local_998 * 4.656613e-10;
                *(float *)(local_f98 + 0x14 + local_948 * 0x20) = (float)local_988 * 4.656613e-10;
                *(float *)(local_f98 + 0x18 + local_948 * 0x20) = (float)local_99c * 4.656613e-10;
                *(float *)(local_f98 + 0x1c + local_948 * 0x20) = (float)local_98c * 4.656613e-10;
                local_948 = local_948 + 1;
              }
              for (local_948 = local_950 << 2; local_948 < local_fb8; local_948 = local_948 + 1) {
                local_9a0 = *(int *)(lVar1 + local_948 * 4) << (bVar20 & 0x1f);
                local_9a4 = *(int *)(lVar2 + local_948 * 4) << (bVar19 & 0x1f);
                local_9a8 = local_9a4 + local_9a0;
                *(float *)(local_f98 + local_948 * 8) = (float)local_9a8 * 4.656613e-10;
                *(float *)(local_f98 + 4 + local_948 * 8) = (float)local_9a4 * 4.656613e-10;
              }
            }
            else {
              local_b18 = local_fb8;
              local_b1c = iVar15;
              local_b28 = lVar1;
              local_b30 = lVar2;
              local_b38 = local_f98;
              local_b48 = local_fb8 >> 2;
              local_b50 = lVar1;
              local_b58 = lVar2;
              local_b5c = iVar3 + 0x18 + (uint)*(byte *)(in_RDI + 0x69);
              local_b60 = iVar3 + 0x18 + (uint)*(byte *)(in_RDI + 0x79);
              local_af8 = 0x34000000;
              local_b08 = 0x34000000;
              uStack_b04 = 0x34000000;
              uStack_b00 = 0x34000000;
              uStack_afc = 0x34000000;
              local_b78._8_4_ = 0x34000000;
              local_b78._0_8_ = 0x3400000034000000;
              local_b78._12_4_ = 0x34000000;
              auVar21 = local_b78;
              for (local_b40 = 0; local_b40 < local_b48; local_b40 = local_b40 + 1) {
                local_a30 = (undefined8 *)(lVar1 + local_b40 * 0x10);
                local_a48 = *local_a30;
                uStack_a20 = local_a30[1];
                uVar10 = local_a48;
                uStack_a40 = uStack_a20;
                uVar11 = uStack_a40;
                local_a4c = local_b5c;
                local_a48._4_4_ = (int)((ulong)local_a48 >> 0x20);
                uStack_a40._0_4_ = (int)uStack_a20;
                uStack_a40._4_4_ = (int)((ulong)uStack_a20 >> 0x20);
                local_b88 = (int)local_a48 << local_b5c;
                iStack_b84 = local_a48._4_4_;
                iStack_b80 = (int)uStack_a40;
                iStack_b7c = uStack_a40._4_4_;
                local_a38 = (undefined8 *)(lVar2 + local_b40 * 0x10);
                local_a68 = *local_a38;
                uStack_a10 = local_a38[1];
                uVar8 = local_a68;
                uStack_a60 = uStack_a10;
                uVar9 = uStack_a60;
                local_a6c = local_b60;
                local_a68._4_4_ = (int)((ulong)local_a68 >> 0x20);
                uStack_a60._0_4_ = (int)uStack_a10;
                uStack_a60._4_4_ = (int)((ulong)uStack_a10 >> 0x20);
                local_b98 = (int)local_a68 << local_b60;
                iStack_b94 = local_a68._4_4_;
                iStack_b90 = (int)uStack_a60;
                iStack_b8c = uStack_a60._4_4_;
                local_a18 = CONCAT44(local_a68._4_4_,local_b98);
                local_a28 = CONCAT44(local_a48._4_4_,local_b88);
                local_ba8 = local_b98 + local_b88;
                iStack_ba4 = local_a68._4_4_ + local_a48._4_4_;
                iStack_ba0 = (int)uStack_a60 + (int)uStack_a40;
                iStack_b9c = uStack_a60._4_4_ + uStack_a40._4_4_;
                local_9f8 = CONCAT44(iStack_ba4,local_ba8);
                uStack_9f0 = CONCAT44(iStack_b9c,iStack_ba0);
                local_ab8 = (float)local_ba8;
                fStack_ab4 = (float)iStack_ba4;
                fStack_ab0 = (float)iStack_ba0;
                fStack_aac = (float)iStack_b9c;
                local_ac8 = 0x3400000034000000;
                uStack_ac0 = local_b78._8_8_;
                local_bb8 = (float)local_ba8 * 1.1920929e-07;
                fStack_bb4 = (float)iStack_ba4 * 1.1920929e-07;
                fStack_bb0 = (float)iStack_ba0 * 1.1920929e-07;
                fStack_bac = (float)iStack_b9c * 1.1920929e-07;
                local_a08 = CONCAT44(local_a68._4_4_,local_b98);
                uStack_a00 = uStack_a10;
                local_ad8 = (float)local_b98;
                fStack_ad4 = (float)local_a68._4_4_;
                fStack_ad0 = (float)(int)uStack_a60;
                fStack_acc = (float)uStack_a60._4_4_;
                local_ae8 = 0x3400000034000000;
                uStack_ae0 = local_b78._8_8_;
                local_bc8 = (float)local_b98 * 1.1920929e-07;
                fStack_bc4 = (float)local_a68._4_4_ * 1.1920929e-07;
                fStack_bc0 = (float)(int)uStack_a60 * 1.1920929e-07;
                fStack_bbc = (float)uStack_a60._4_4_ * 1.1920929e-07;
                local_a78 = (undefined8 *)(local_f98 + local_b40 * 0x20);
                local_9d8 = CONCAT44(fStack_bb4,local_bb8);
                uStack_9d0 = CONCAT44(fStack_bac,fStack_bb0);
                local_9e8 = CONCAT44(fStack_bc4,local_bc8);
                uStack_9e0 = CONCAT44(fStack_bbc,fStack_bc0);
                local_a88 = local_bb8;
                fStack_a84 = local_bc8;
                fStack_a80 = fStack_bb4;
                fStack_a7c = fStack_bc4;
                *local_a78 = CONCAT44(local_bc8,local_bb8);
                local_a78[1] = CONCAT44(fStack_bc4,fStack_bb4);
                local_a90 = (undefined1 (*) [16])(local_f98 + 0x10 + local_b40 * 0x20);
                local_9b8 = CONCAT44(fStack_bb4,local_bb8);
                fStack_9ac = fStack_bac;
                local_9a8 = local_ba8;
                local_9c8 = CONCAT44(fStack_bc4,local_bc8);
                uStack_9c0 = CONCAT44(fStack_bbc,fStack_bc0);
                local_aa8 = uStack_9b0;
                fStack_aa4 = fStack_bc0;
                fStack_aa0 = fStack_bac;
                fStack_a9c = fStack_bbc;
                auVar5._4_4_ = fStack_bc0;
                auVar5._0_4_ = uStack_9b0;
                auVar5._8_4_ = fStack_bac;
                auVar5._12_4_ = fStack_bbc;
                *local_a90 = auVar5;
                local_a68 = uVar8;
                uStack_a60 = uVar9;
                local_a48 = uVar10;
                uStack_a40 = uVar11;
              }
              for (local_b40 = local_b48 << 2; local_b78 = auVar21, local_b40 < local_fb8;
                  local_b40 = local_b40 + 1) {
                local_bcc = *(int *)(lVar1 + local_b40 * 4) << ((byte)local_b5c & 0x1f);
                local_bd0 = *(int *)(lVar2 + local_b40 * 4) << ((byte)local_b60 & 0x1f);
                local_bd4 = local_bd0 + local_bcc;
                *(float *)(local_f98 + local_b40 * 8) = (float)local_bd4 / 8388608.0;
                *(float *)(local_f98 + 4 + local_b40 * 8) = (float)local_bd0 / 8388608.0;
              }
            }
            break;
          case 10:
            local_ee8 = local_fb8;
            local_eec = iVar15;
            local_ef8 = lVar1;
            local_f00 = lVar2;
            local_f08 = local_f98;
            if ((ma_dr_flac__gIsSSE2Supported == 0) || (0x18 < *(byte *)(in_RDI + 0x35))) {
              local_288 = local_fb8;
              local_28c = iVar15;
              local_298 = lVar1;
              local_2a0 = lVar2;
              local_2a8 = local_f98;
              local_2b8 = local_fb8 >> 2;
              local_2c0 = lVar1;
              local_2c8 = lVar2;
              local_2cc = iVar15;
              local_2d0 = 0x30000000;
              if (iVar15 == 0) {
                for (local_2b0 = 0; local_2b0 < local_2b8; local_2b0 = local_2b0 + 1) {
                  local_344 = *(int *)(lVar2 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_348 = *(int *)(lVar2 + 4 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_34c = *(int *)(lVar2 + 8 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_350 = *(int *)(lVar2 + 0xc + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_334 = (*(int *)(lVar1 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_344 & 1;
                  local_338 = (*(int *)(lVar1 + 4 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_348 & 1;
                  local_33c = (*(int *)(lVar1 + 8 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_34c & 1;
                  local_340 = (*(int *)(lVar1 + 0xc + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_350 & 1;
                  local_314 = (int)(local_334 + local_344) >> 1;
                  local_318 = (int)(local_338 + local_348) >> 1;
                  local_31c = (int)(local_33c + local_34c) >> 1;
                  local_320 = (int)(local_340 + local_350) >> 1;
                  local_324 = (int)(local_334 - local_344) >> 1;
                  local_328 = (int)(local_338 - local_348) >> 1;
                  local_32c = (int)(local_33c - local_34c) >> 1;
                  local_330 = (int)(local_340 - local_350) >> 1;
                  *(float *)(local_f98 + local_2b0 * 0x20) = (float)local_314 * 4.656613e-10;
                  *(float *)(local_f98 + 4 + local_2b0 * 0x20) = (float)local_324 * 4.656613e-10;
                  *(float *)(local_f98 + 8 + local_2b0 * 0x20) = (float)local_318 * 4.656613e-10;
                  *(float *)(local_f98 + 0xc + local_2b0 * 0x20) = (float)local_328 * 4.656613e-10;
                  *(float *)(local_f98 + 0x10 + local_2b0 * 0x20) = (float)local_31c * 4.656613e-10;
                  *(float *)(local_f98 + 0x14 + local_2b0 * 0x20) = (float)local_32c * 4.656613e-10;
                  *(float *)(local_f98 + 0x18 + local_2b0 * 0x20) = (float)local_320 * 4.656613e-10;
                  *(float *)(local_f98 + 0x1c + local_2b0 * 0x20) = (float)local_330 * 4.656613e-10;
                }
              }
              else {
                local_2cc = iVar3 + 0x1f;
                for (local_2b0 = 0; local_2b0 < local_2b8; local_2b0 = local_2b0 + 1) {
                  local_304 = *(int *)(lVar2 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_308 = *(int *)(lVar2 + 4 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_30c = *(int *)(lVar2 + 8 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_310 = *(int *)(lVar2 + 0xc + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_2f4 = (*(int *)(lVar1 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_304 & 1;
                  local_2f8 = (*(int *)(lVar1 + 4 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_308 & 1;
                  local_2fc = (*(int *)(lVar1 + 8 + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_30c & 1;
                  local_300 = (*(int *)(lVar1 + 0xc + local_2b0 * 0x10) <<
                              (*(byte *)(in_RDI + 0x69) & 0x1f)) << 1 | local_310 & 1;
                  bVar20 = (byte)(iVar3 + 0x1f);
                  local_2d4 = local_2f4 + local_304 << (bVar20 & 0x1f);
                  local_2d8 = local_2f8 + local_308 << (bVar20 & 0x1f);
                  local_2dc = local_2fc + local_30c << (bVar20 & 0x1f);
                  local_2e0 = local_300 + local_310 << (bVar20 & 0x1f);
                  local_2e4 = local_2f4 - local_304 << (bVar20 & 0x1f);
                  local_2e8 = local_2f8 - local_308 << (bVar20 & 0x1f);
                  local_2ec = local_2fc - local_30c << (bVar20 & 0x1f);
                  local_2f0 = local_300 - local_310 << (bVar20 & 0x1f);
                  *(float *)(local_f98 + local_2b0 * 0x20) = (float)local_2d4 * 4.656613e-10;
                  *(float *)(local_f98 + 4 + local_2b0 * 0x20) = (float)local_2e4 * 4.656613e-10;
                  *(float *)(local_f98 + 8 + local_2b0 * 0x20) = (float)local_2d8 * 4.656613e-10;
                  *(float *)(local_f98 + 0xc + local_2b0 * 0x20) = (float)local_2e8 * 4.656613e-10;
                  *(float *)(local_f98 + 0x10 + local_2b0 * 0x20) = (float)local_2dc * 4.656613e-10;
                  *(float *)(local_f98 + 0x14 + local_2b0 * 0x20) = (float)local_2ec * 4.656613e-10;
                  *(float *)(local_f98 + 0x18 + local_2b0 * 0x20) = (float)local_2e0 * 4.656613e-10;
                  *(float *)(local_f98 + 0x1c + local_2b0 * 0x20) = (float)local_2f0 * 4.656613e-10;
                }
              }
              for (local_2b0 = local_2b8 << 2; local_2b0 < local_fb8; local_2b0 = local_2b0 + 1) {
                local_358 = *(int *)(lVar2 + local_2b0 * 4) << (*(byte *)(in_RDI + 0x79) & 0x1f);
                local_354 = (*(int *)(lVar1 + local_2b0 * 4) << (*(byte *)(in_RDI + 0x69) & 0x1f))
                            << 1 | local_358 & 1;
                *(float *)(local_f98 + local_2b0 * 8) =
                     (float)(((int)(local_354 + local_358) >> 1) << (bVar19 & 0x1f)) * 4.656613e-10;
                *(float *)(local_f98 + 4 + local_2b0 * 8) =
                     (float)(((int)(local_354 - local_358) >> 1) << (bVar19 & 0x1f)) * 4.656613e-10;
              }
            }
            else {
              local_7d8 = local_fb8;
              local_7dc = iVar15;
              local_7e8 = lVar1;
              local_7f0 = lVar2;
              local_7f8 = local_f98;
              local_808 = local_fb8 >> 2;
              local_810 = lVar1;
              local_818 = lVar2;
              local_81c = iVar3 + 0x18;
              local_820 = 0x34000000;
              local_7b8 = 0x34000000;
              local_7c8 = 0x34000000;
              uStack_7c4 = 0x34000000;
              uStack_7c0 = 0x34000000;
              uStack_7bc = 0x34000000;
              local_838._8_4_ = 0x34000000;
              local_838._0_8_ = 0x3400000034000000;
              local_838._12_4_ = 0x34000000;
              auVar21 = local_838;
              local_838 = auVar21;
              if (iVar3 + 0x18 == 0) {
                for (local_800 = 0; local_800 < local_808; local_800 = local_800 + 1) {
                  local_5a0 = (undefined8 *)(lVar1 + local_800 * 0x10);
                  local_5c8 = *local_5a0;
                  uStack_600 = local_5a0[1];
                  uVar9 = local_5c8;
                  uStack_5c0 = uStack_600;
                  uVar12 = uStack_5c0;
                  local_5cc = (uint)*(byte *)(in_RDI + 0x69);
                  local_5c8._4_4_ = (undefined4)((ulong)local_5c8 >> 0x20);
                  uStack_5c0._4_4_ = (undefined4)(uStack_600 >> 0x20);
                  local_5c8._0_4_ = (int)local_5c8 << (uint)*(byte *)(in_RDI + 0x69);
                  local_848 = CONCAT44(local_5c8._4_4_,(int)local_5c8);
                  local_5a8 = (undefined8 *)(lVar2 + local_800 * 0x10);
                  local_5e8 = *local_5a8;
                  uStack_4a0 = local_5a8[1];
                  uVar8 = local_5e8;
                  uStack_5e0 = uStack_4a0;
                  uVar18 = uStack_5e0;
                  local_5ec = (uint)*(byte *)(in_RDI + 0x79);
                  local_5e8._4_4_ = (int)((ulong)local_5e8 >> 0x20);
                  uStack_5e0._0_4_ = (int)uStack_4a0;
                  uStack_5e0._4_4_ = (int)(uStack_4a0 >> 0x20);
                  local_858 = (int)local_5e8 << (uint)*(byte *)(in_RDI + 0x79);
                  iStack_854 = local_5e8._4_4_;
                  iStack_850 = (int)uStack_5e0;
                  iStack_84c = uStack_5e0._4_4_;
                  local_608 = local_848;
                  local_60c = 1;
                  local_4e8 = (int)local_5c8 << 1;
                  local_490 = 1;
                  local_43c = 1;
                  local_440 = 1;
                  local_444 = 1;
                  local_448 = 1;
                  local_458 = 0x100000001;
                  uStack_450 = 0x100000001;
                  local_4a8 = CONCAT44(local_5e8._4_4_,local_858);
                  local_4b8 = 0x100000001;
                  uStack_4b0 = 0x100000001;
                  local_4f8 = CONCAT44(local_5e8._4_4_,local_858) & 0x100000001;
                  uStack_4e4 = local_5c8._4_4_;
                  uStack_4e0 = (int)uStack_600;
                  uStack_4dc = uStack_5c0._4_4_;
                  uStack_4f0 = uStack_4a0 & 0x100000001;
                  local_848 = CONCAT44(local_5c8._4_4_,local_4e8) | local_4f8;
                  uStack_840 = uStack_600 | uStack_4a0 & 0x100000001;
                  local_528 = local_848;
                  uVar13 = local_528;
                  uStack_520 = uStack_840;
                  uVar14 = uStack_520;
                  local_538 = CONCAT44(local_5e8._4_4_,local_858);
                  uStack_530 = uStack_4a0;
                  local_528._0_4_ = (int)local_848;
                  local_528._4_4_ = (int)(local_848 >> 0x20);
                  uStack_520._0_4_ = (int)uStack_840;
                  uStack_520._4_4_ = (int)(uStack_840 >> 0x20);
                  local_468 = (int)local_528 + local_858;
                  iStack_464 = local_528._4_4_ + local_5e8._4_4_;
                  iStack_460 = (int)uStack_520 + (int)uStack_5e0;
                  iStack_45c = uStack_520._4_4_ + uStack_5e0._4_4_;
                  local_46c = 1;
                  auVar21 = ZEXT416(1);
                  local_868 = (int)local_528 + local_858 >> auVar21;
                  iStack_864 = local_528._4_4_ + local_5e8._4_4_ >> auVar21;
                  iStack_860 = (int)uStack_520 + (int)uStack_5e0 >> auVar21;
                  iStack_85c = uStack_520._4_4_ + uStack_5e0._4_4_ >> auVar21;
                  local_568 = local_848;
                  uStack_560 = uStack_840;
                  local_578 = CONCAT44(local_5e8._4_4_,local_858);
                  uStack_570 = uStack_4a0;
                  local_488 = (int)local_528 - local_858;
                  iStack_484 = local_528._4_4_ - local_5e8._4_4_;
                  iStack_480 = (int)uStack_520 - (int)uStack_5e0;
                  iStack_47c = uStack_520._4_4_ - uStack_5e0._4_4_;
                  local_48c = 1;
                  auVar21 = ZEXT416(1);
                  local_878 = (int)local_528 - local_858 >> auVar21;
                  iStack_874 = local_528._4_4_ - local_5e8._4_4_ >> auVar21;
                  iStack_870 = (int)uStack_520 - (int)uStack_5e0 >> auVar21;
                  iStack_86c = uStack_520._4_4_ - uStack_5e0._4_4_ >> auVar21;
                  local_3e8 = CONCAT44(iStack_864,local_868);
                  uStack_3e0 = CONCAT44(iStack_85c,iStack_860);
                  local_738 = (float)local_868;
                  fStack_734 = (float)iStack_864;
                  fStack_730 = (float)iStack_860;
                  fStack_72c = (float)iStack_85c;
                  local_748 = 0x3400000034000000;
                  uStack_740 = local_838._8_8_;
                  local_888 = (float)local_868 * 1.1920929e-07;
                  fStack_884 = (float)iStack_864 * 1.1920929e-07;
                  fStack_880 = (float)iStack_860 * 1.1920929e-07;
                  fStack_87c = (float)iStack_85c * 1.1920929e-07;
                  local_3f8 = CONCAT44(iStack_874,local_878);
                  uStack_3f0 = CONCAT44(iStack_86c,iStack_870);
                  local_758 = (float)(int)local_878;
                  fStack_754 = (float)iStack_874;
                  fStack_750 = (float)iStack_870;
                  fStack_74c = (float)iStack_86c;
                  local_768 = 0x3400000034000000;
                  uStack_760 = local_838._8_8_;
                  local_898 = (float)(int)local_878 * 1.1920929e-07;
                  fStack_894 = (float)iStack_874 * 1.1920929e-07;
                  fStack_890 = (float)iStack_870 * 1.1920929e-07;
                  fStack_88c = (float)iStack_86c * 1.1920929e-07;
                  local_6b8 = (undefined8 *)(local_f98 + local_800 * 0x20);
                  local_3a8 = CONCAT44(fStack_884,local_888);
                  uStack_3a0 = CONCAT44(fStack_87c,fStack_880);
                  local_3b8 = CONCAT44(fStack_894,local_898);
                  uStack_3b0 = CONCAT44(fStack_88c,fStack_890);
                  local_6c8 = local_888;
                  fStack_6c4 = local_898;
                  fStack_6c0 = fStack_884;
                  fStack_6bc = fStack_894;
                  *local_6b8 = CONCAT44(local_898,local_888);
                  local_6b8[1] = CONCAT44(fStack_894,fStack_884);
                  local_6d0 = (undefined1 (*) [16])(local_f98 + 0x10 + local_800 * 0x20);
                  local_368 = CONCAT44(fStack_884,local_888);
                  fStack_35c = fStack_87c;
                  local_358 = local_878;
                  local_378 = CONCAT44(fStack_894,local_898);
                  uStack_370 = CONCAT44(fStack_88c,fStack_890);
                  local_6e8 = uStack_360;
                  fStack_6e4 = fStack_890;
                  fStack_6e0 = fStack_87c;
                  fStack_6dc = fStack_88c;
                  auVar6._4_4_ = fStack_890;
                  auVar6._0_4_ = uStack_360;
                  auVar6._8_4_ = fStack_87c;
                  auVar6._12_4_ = fStack_88c;
                  *local_6d0 = auVar6;
                  local_5e8 = uVar8;
                  uStack_5e0 = uVar18;
                  local_5c8 = uVar9;
                  uStack_5c0 = uVar12;
                  local_528 = uVar13;
                  uStack_520 = uVar14;
                }
                for (local_800 = local_808 << 2; local_800 < local_fb8; local_800 = local_800 + 1) {
                  local_8a0 = *(int *)(lVar2 + local_800 * 4) << (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_89c = (*(int *)(lVar1 + local_800 * 4) << (*(byte *)(in_RDI + 0x69) & 0x1f))
                              << 1 | local_8a0 & 1;
                  *(float *)(local_f98 + local_800 * 8) =
                       (float)((int)(local_89c + local_8a0) >> 1) * 1.1920929e-07;
                  *(float *)(local_f98 + 4 + local_800 * 8) =
                       (float)((int)(local_89c - local_8a0) >> 1) * 1.1920929e-07;
                }
              }
              else {
                local_81c = iVar3 + 0x17;
                for (local_800 = 0; local_800 < local_808; local_800 = local_800 + 1) {
                  local_5b0 = (undefined8 *)(lVar1 + local_800 * 0x10);
                  local_628 = *local_5b0;
                  uStack_660 = local_5b0[1];
                  uVar9 = local_628;
                  uStack_620 = uStack_660;
                  uVar12 = uStack_620;
                  local_62c = (uint)*(byte *)(in_RDI + 0x69);
                  local_628._4_4_ = (undefined4)((ulong)local_628 >> 0x20);
                  uStack_620._4_4_ = (undefined4)(uStack_660 >> 0x20);
                  local_628._0_4_ = (int)local_628 << (uint)*(byte *)(in_RDI + 0x69);
                  local_8b8 = CONCAT44(local_628._4_4_,(int)local_628);
                  local_5b8 = (undefined8 *)(lVar2 + local_800 * 0x10);
                  local_648 = *local_5b8;
                  uStack_4c0 = local_5b8[1];
                  uVar8 = local_648;
                  uStack_640 = uStack_4c0;
                  uVar18 = uStack_640;
                  local_64c = (uint)*(byte *)(in_RDI + 0x79);
                  local_648._4_4_ = (int)((ulong)local_648 >> 0x20);
                  uStack_640._0_4_ = (int)uStack_4c0;
                  uStack_640._4_4_ = (int)(uStack_4c0 >> 0x20);
                  local_8c8 = (int)local_648 << (uint)*(byte *)(in_RDI + 0x79);
                  iStack_8c4 = local_648._4_4_;
                  iStack_8c0 = (int)uStack_640;
                  iStack_8bc = uStack_640._4_4_;
                  local_668 = local_8b8;
                  local_66c = 1;
                  local_508 = (int)local_628 << 1;
                  local_494 = 1;
                  local_41c = 1;
                  local_420 = 1;
                  local_424 = 1;
                  local_428 = 1;
                  local_438 = 0x100000001;
                  uStack_430 = 0x100000001;
                  local_4c8 = CONCAT44(local_648._4_4_,local_8c8);
                  local_4d8 = 0x100000001;
                  uStack_4d0 = 0x100000001;
                  local_518 = CONCAT44(local_648._4_4_,local_8c8) & 0x100000001;
                  uStack_504 = local_628._4_4_;
                  uStack_500 = (int)uStack_660;
                  uStack_4fc = uStack_620._4_4_;
                  uStack_510 = uStack_4c0 & 0x100000001;
                  local_8b8 = CONCAT44(local_628._4_4_,local_508) | local_518;
                  uStack_8b0 = uStack_660 | uStack_4c0 & 0x100000001;
                  local_548 = local_8b8;
                  uVar13 = local_548;
                  uStack_540 = uStack_8b0;
                  uVar14 = uStack_540;
                  local_558 = CONCAT44(local_648._4_4_,local_8c8);
                  uStack_550 = uStack_4c0;
                  local_548._0_4_ = (int)local_8b8;
                  local_548._4_4_ = (int)(local_8b8 >> 0x20);
                  uStack_540._0_4_ = (int)uStack_8b0;
                  uStack_540._4_4_ = (int)(uStack_8b0 >> 0x20);
                  iStack_684 = local_548._4_4_ + local_648._4_4_;
                  iStack_680 = (int)uStack_540 + (int)uStack_640;
                  iStack_67c = uStack_540._4_4_ + uStack_640._4_4_;
                  local_688 = (int)local_548 + local_8c8;
                  local_68c = local_81c;
                  local_8d8 = (int)local_548 + local_8c8 << local_81c;
                  iStack_8d4 = iStack_684;
                  iStack_8d0 = iStack_680;
                  iStack_8cc = iStack_67c;
                  local_588 = local_8b8;
                  uStack_580 = uStack_8b0;
                  local_598 = CONCAT44(local_648._4_4_,local_8c8);
                  uStack_590 = uStack_4c0;
                  iStack_6a4 = local_548._4_4_ - local_648._4_4_;
                  iStack_6a0 = (int)uStack_540 - (int)uStack_640;
                  iStack_69c = uStack_540._4_4_ - uStack_640._4_4_;
                  local_6a8 = (int)local_548 - local_8c8;
                  local_6ac = local_81c;
                  local_8e8 = (int)local_548 - local_8c8 << local_81c;
                  iStack_8e4 = iStack_6a4;
                  iStack_8e0 = iStack_6a0;
                  iStack_8dc = iStack_69c;
                  local_408 = CONCAT44(iStack_684,local_8d8);
                  uStack_400 = CONCAT44(iStack_67c,iStack_680);
                  local_778 = (float)local_8d8;
                  fStack_774 = (float)iStack_684;
                  fStack_770 = (float)iStack_680;
                  fStack_76c = (float)iStack_67c;
                  local_788 = 0x3400000034000000;
                  uStack_780 = local_838._8_8_;
                  local_8f8 = (float)local_8d8 * 1.1920929e-07;
                  fStack_8f4 = (float)iStack_684 * 1.1920929e-07;
                  fStack_8f0 = (float)iStack_680 * 1.1920929e-07;
                  fStack_8ec = (float)iStack_67c * 1.1920929e-07;
                  local_418 = CONCAT44(iStack_6a4,local_8e8);
                  uStack_410 = CONCAT44(iStack_69c,iStack_6a0);
                  local_798 = (float)local_8e8;
                  fStack_794 = (float)iStack_6a4;
                  fStack_790 = (float)iStack_6a0;
                  fStack_78c = (float)iStack_69c;
                  local_7a8 = 0x3400000034000000;
                  uStack_7a0 = local_838._8_8_;
                  local_908 = (float)local_8e8 * 1.1920929e-07;
                  fStack_904 = (float)iStack_6a4 * 1.1920929e-07;
                  fStack_900 = (float)iStack_6a0 * 1.1920929e-07;
                  fStack_8fc = (float)iStack_69c * 1.1920929e-07;
                  local_6f0 = (undefined8 *)(local_f98 + local_800 * 0x20);
                  local_3c8 = CONCAT44(fStack_8f4,local_8f8);
                  uStack_3c0 = CONCAT44(fStack_8ec,fStack_8f0);
                  local_3d8 = CONCAT44(fStack_904,local_908);
                  uStack_3d0 = CONCAT44(fStack_8fc,fStack_900);
                  local_708 = local_8f8;
                  fStack_704 = local_908;
                  fStack_700 = fStack_8f4;
                  fStack_6fc = fStack_904;
                  *local_6f0 = CONCAT44(local_908,local_8f8);
                  local_6f0[1] = CONCAT44(fStack_904,fStack_8f4);
                  local_710 = (undefined1 (*) [16])(local_f98 + 0x10 + local_800 * 0x20);
                  local_388 = CONCAT44(fStack_8f4,local_8f8);
                  fStack_37c = fStack_8ec;
                  local_378 = CONCAT44(local_378._4_4_,local_8e8);
                  local_398 = CONCAT44(fStack_904,local_908);
                  uStack_390 = CONCAT44(fStack_8fc,fStack_900);
                  local_728 = uStack_380;
                  fStack_724 = fStack_900;
                  fStack_720 = fStack_8ec;
                  fStack_71c = fStack_8fc;
                  auVar21._4_4_ = fStack_900;
                  auVar21._0_4_ = uStack_380;
                  auVar21._8_4_ = fStack_8ec;
                  auVar21._12_4_ = fStack_8fc;
                  *local_710 = auVar21;
                  local_648 = uVar8;
                  uStack_640 = uVar18;
                  local_628 = uVar9;
                  uStack_620 = uVar12;
                  local_548 = uVar13;
                  uStack_540 = uVar14;
                }
                for (local_800 = local_808 << 2; local_800 < local_fb8; local_800 = local_800 + 1) {
                  local_910 = *(int *)(lVar2 + local_800 * 4) << (*(byte *)(in_RDI + 0x79) & 0x1f);
                  local_90c = (*(int *)(lVar1 + local_800 * 4) << (*(byte *)(in_RDI + 0x69) & 0x1f))
                              << 1 | local_910 & 1;
                  *(float *)(local_f98 + local_800 * 8) =
                       (float)(int)(local_90c + local_910 << ((byte)local_81c & 0x1f)) *
                       1.1920929e-07;
                  *(float *)(local_f98 + 4 + local_800 * 8) =
                       (float)(int)(local_90c - local_910 << ((byte)local_81c & 0x1f)) *
                       1.1920929e-07;
                }
              }
            }
          }
        }
        else {
          for (local_fd0 = 0; local_fd0 < local_fb8; local_fd0 = local_fd0 + 1) {
            for (local_fd4 = 0; local_fd4 < uVar17; local_fd4 = local_fd4 + 1) {
              *(float *)(local_f98 + (local_fd0 * uVar17 + (ulong)local_fd4) * 4) =
                   (float)(*(int *)(*(long *)(in_RDI + (ulong)local_fd4 * 0x10 + 0x70) +
                                   (uVar18 + local_fd0) * 4) <<
                          (bVar19 + *(char *)(in_RDI + (ulong)local_fd4 * 0x10 + 0x69) & 0x1f)) /
                   2.1474836e+09;
            }
          }
        }
        local_fa0 = local_fb8 + local_fa0;
        local_f98 = local_fb8 * uVar17 * 4 + local_f98;
        local_f90 = local_f90 - local_fb8;
        *(ulong *)(in_RDI + 0xe8) = local_fb8 + *(long *)(in_RDI + 0xe8);
        *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) - (int)local_fb8;
      }
      mVar16 = ma_dr_flac__read_and_decode_next_flac_frame(in_stack_fffffffffffff018);
    } while (mVar16 != 0);
LAB_0023b31b:
    local_f80 = local_fa0;
  }
  return local_f80;
}

Assistant:

MA_API ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac* pFlac, ma_uint64 framesToRead, float* pBufferOut)
{
    ma_uint64 framesRead;
    ma_uint32 unusedBitsPerSample;
    if (pFlac == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, framesToRead);
    }
    MA_DR_FLAC_ASSERT(pFlac->bitsPerSample <= 32);
    unusedBitsPerSample = 32 - pFlac->bitsPerSample;
    framesRead = 0;
    while (framesToRead > 0) {
        if (pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                break;
            }
        } else {
            unsigned int channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
            ma_uint64 iFirstPCMFrame = pFlac->currentFLACFrame.header.blockSizeInPCMFrames - pFlac->currentFLACFrame.pcmFramesRemaining;
            ma_uint64 frameCountThisIteration = framesToRead;
            if (frameCountThisIteration > pFlac->currentFLACFrame.pcmFramesRemaining) {
                frameCountThisIteration = pFlac->currentFLACFrame.pcmFramesRemaining;
            }
            if (channelCount == 2) {
                const ma_int32* pDecodedSamples0 = pFlac->currentFLACFrame.subframes[0].pSamplesS32 + iFirstPCMFrame;
                const ma_int32* pDecodedSamples1 = pFlac->currentFLACFrame.subframes[1].pSamplesS32 + iFirstPCMFrame;
                switch (pFlac->currentFLACFrame.header.channelAssignment)
                {
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_LEFT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_left_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_RIGHT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_right_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_MID_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_mid_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_INDEPENDENT:
                    default:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_independent_stereo(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                }
            } else {
                ma_uint64 i;
                for (i = 0; i < frameCountThisIteration; ++i) {
                    unsigned int j;
                    for (j = 0; j < channelCount; ++j) {
                        ma_int32 sampleS32 = (ma_int32)((ma_uint32)(pFlac->currentFLACFrame.subframes[j].pSamplesS32[iFirstPCMFrame + i]) << (unusedBitsPerSample + pFlac->currentFLACFrame.subframes[j].wastedBitsPerSample));
                        pBufferOut[(i*channelCount)+j] = (float)(sampleS32 / 2147483648.0);
                    }
                }
            }
            framesRead                += frameCountThisIteration;
            pBufferOut                += frameCountThisIteration * channelCount;
            framesToRead              -= frameCountThisIteration;
            pFlac->currentPCMFrame    += frameCountThisIteration;
            pFlac->currentFLACFrame.pcmFramesRemaining -= (unsigned int)frameCountThisIteration;
        }
    }
    return framesRead;
}